

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

void __thiscall hiberlite::Database::registerBeanClass<Person>(Database *this)

{
  ModelExtractor *pMVar1;
  string classname;
  shared_connection local_40;
  string local_30 [32];
  
  if (this->mx == (ModelExtractor *)0x0) {
    pMVar1 = (ModelExtractor *)operator_new(0xf0);
    ModelExtractor::ModelExtractor(pMVar1);
    this->mx = pMVar1;
  }
  getClassName<Person>();
  pMVar1 = this->mx;
  local_40._vptr_shared_res = (_func_int **)&PTR__shared_res_0018e7d0;
  local_40.res = (this->con).res;
  if (local_40.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_40.res)->refCount = (local_40.res)->refCount + 1;
  }
  ModelExtractor::extractModel<Person>(pMVar1,&local_40);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_40);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void Database::registerBeanClass()
{
	if(!mx)
		mx=new ModelExtractor();
	std::string classname=Database::getClassName<C>();

	mx->extractModel<C>(con);
}